

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.cpp
# Opt level: O2

void __thiscall QDataStream::abortTransaction(QDataStream *this)

{
  quint16 qVar1;
  long in_FS_OFFSET;
  QMessageLogger local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  this->q_status = '\x02';
  if (this->transactionDepth == 0) {
    local_28.context.version = 2;
    local_28.context.function._4_4_ = 0;
    local_28.context._4_8_ = 0;
    local_28.context._12_8_ = 0;
    local_28.context.category = "default";
    QMessageLogger::warning(&local_28,"QDataStream: No transaction in progress");
  }
  else {
    qVar1 = this->transactionDepth - 1;
    this->transactionDepth = qVar1;
    if ((qVar1 == 0) && (this->dev != (QIODevice *)0x0)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        QIODevice::commitTransaction(this->dev);
        return;
      }
      goto LAB_002bdc80;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
LAB_002bdc80:
  __stack_chk_fail();
}

Assistant:

void QDataStream::abortTransaction()
{
    q_status = ReadCorruptData;

    CHECK_STREAM_TRANSACTION_PRECOND(Q_VOID)
    if (--transactionDepth != 0)
        return;

    CHECK_STREAM_PRECOND(Q_VOID)
    dev->commitTransaction();
}